

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O1

void itrans_dct2_h8_w8_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  
  auVar2 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + 8),*(undefined1 (*) [16])(src + 0x18));
  auVar18 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + 8),*(undefined1 (*) [16])(src + 0x18));
  auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + 0x28),*(undefined1 (*) [16])(src + 0x38));
  auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + 0x28),*(undefined1 (*) [16])(src + 0x38));
  auVar23._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar2;
  auVar23._16_16_ = ZEXT116(1) * auVar18;
  auVar6._8_4_ = 0x26002c;
  auVar6._0_8_ = 0x26002c0026002c;
  auVar6._12_4_ = 0x26002c;
  auVar6._16_4_ = 0x26002c;
  auVar6._20_4_ = 0x26002c;
  auVar6._24_4_ = 0x26002c;
  auVar6._28_4_ = 0x26002c;
  auVar33 = vpmaddwd_avx2(auVar23,auVar6);
  auVar27._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
  auVar27._16_16_ = ZEXT116(1) * auVar1;
  auVar7._8_4_ = 0x90019;
  auVar7._0_8_ = 0x9001900090019;
  auVar7._12_4_ = 0x90019;
  auVar7._16_4_ = 0x90019;
  auVar7._20_4_ = 0x90019;
  auVar7._24_4_ = 0x90019;
  auVar7._28_4_ = 0x90019;
  auVar11 = vpmaddwd_avx2(auVar27,auVar7);
  auVar33 = vpaddd_avx2(auVar11,auVar33);
  auVar8._8_4_ = 0xfff70026;
  auVar8._0_8_ = 0xfff70026fff70026;
  auVar8._12_4_ = 0xfff70026;
  auVar8._16_4_ = 0xfff70026;
  auVar8._20_4_ = 0xfff70026;
  auVar8._24_4_ = 0xfff70026;
  auVar8._28_4_ = 0xfff70026;
  auVar11 = vpmaddwd_avx2(auVar23,auVar8);
  auVar9._8_4_ = 0xffe7ffd4;
  auVar9._0_8_ = 0xffe7ffd4ffe7ffd4;
  auVar9._12_4_ = 0xffe7ffd4;
  auVar9._16_4_ = 0xffe7ffd4;
  auVar9._20_4_ = 0xffe7ffd4;
  auVar9._24_4_ = 0xffe7ffd4;
  auVar9._28_4_ = 0xffe7ffd4;
  auVar32 = vpmaddwd_avx2(auVar27,auVar9);
  auVar11 = vpaddd_avx2(auVar32,auVar11);
  auVar10._8_4_ = 0xffd40019;
  auVar10._0_8_ = 0xffd40019ffd40019;
  auVar10._12_4_ = 0xffd40019;
  auVar10._16_4_ = 0xffd40019;
  auVar10._20_4_ = 0xffd40019;
  auVar10._24_4_ = 0xffd40019;
  auVar10._28_4_ = 0xffd40019;
  auVar19._8_4_ = 0x260009;
  auVar19._0_8_ = 0x26000900260009;
  auVar19._12_4_ = 0x260009;
  auVar19._16_4_ = 0x260009;
  auVar19._20_4_ = 0x260009;
  auVar19._24_4_ = 0x260009;
  auVar19._28_4_ = 0x260009;
  auVar32 = vpmaddwd_avx2(auVar23,auVar10);
  auVar15 = vpmaddwd_avx2(auVar27,auVar19);
  auVar22._8_4_ = 0xffe70009;
  auVar22._0_8_ = 0xffe70009ffe70009;
  auVar22._12_4_ = 0xffe70009;
  auVar22._16_4_ = 0xffe70009;
  auVar22._20_4_ = 0xffe70009;
  auVar22._24_4_ = 0xffe70009;
  auVar22._28_4_ = 0xffe70009;
  auVar32 = vpaddd_avx2(auVar15,auVar32);
  auVar15 = vpmaddwd_avx2(auVar23,auVar22);
  auVar24._8_4_ = 0xffd40026;
  auVar24._0_8_ = 0xffd40026ffd40026;
  auVar24._12_4_ = 0xffd40026;
  auVar24._16_4_ = 0xffd40026;
  auVar24._20_4_ = 0xffd40026;
  auVar24._24_4_ = 0xffd40026;
  auVar24._28_4_ = 0xffd40026;
  auVar31 = vpmaddwd_avx2(auVar27,auVar24);
  auVar15 = vpaddd_avx2(auVar31,auVar15);
  auVar2 = vpunpcklwd_avx(*(undefined1 (*) [16])src,*(undefined1 (*) [16])(src + 0x20));
  auVar18 = vpunpckhwd_avx(*(undefined1 (*) [16])src,*(undefined1 (*) [16])(src + 0x20));
  auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + 0x10),*(undefined1 (*) [16])(src + 0x30));
  auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + 0x10),*(undefined1 (*) [16])(src + 0x30));
  auVar28._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar2;
  auVar28._16_16_ = ZEXT116(1) * auVar18;
  auVar26._8_2_ = 0x20;
  auVar26._0_8_ = 0x20002000200020;
  auVar26._10_2_ = 0x20;
  auVar26._12_2_ = 0x20;
  auVar26._14_2_ = 0x20;
  auVar26._16_2_ = 0x20;
  auVar26._18_2_ = 0x20;
  auVar26._20_2_ = 0x20;
  auVar26._22_2_ = 0x20;
  auVar26._24_2_ = 0x20;
  auVar26._26_2_ = 0x20;
  auVar26._28_2_ = 0x20;
  auVar26._30_2_ = 0x20;
  auVar12._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
  auVar12._16_16_ = ZEXT116(1) * auVar1;
  auVar31 = vpmaddwd_avx2(auVar28,auVar26);
  auVar21._8_4_ = 0x11002a;
  auVar21._0_8_ = 0x11002a0011002a;
  auVar21._12_4_ = 0x11002a;
  auVar21._16_4_ = 0x11002a;
  auVar21._20_4_ = 0x11002a;
  auVar21._24_4_ = 0x11002a;
  auVar21._28_4_ = 0x11002a;
  auVar14 = vpmaddwd_avx2(auVar12,auVar21);
  auVar16 = vpsubd_avx2(auVar31,auVar14);
  auVar31 = vpaddd_avx2(auVar31,auVar14);
  auVar30._8_4_ = 0xffe00020;
  auVar30._0_8_ = 0xffe00020ffe00020;
  auVar30._12_4_ = 0xffe00020;
  auVar30._16_4_ = 0xffe00020;
  auVar30._20_4_ = 0xffe00020;
  auVar30._24_4_ = 0xffe00020;
  auVar30._28_4_ = 0xffe00020;
  auVar14 = vpmaddwd_avx2(auVar28,auVar30);
  auVar29._8_4_ = 0xffd60011;
  auVar29._0_8_ = 0xffd60011ffd60011;
  auVar29._12_4_ = 0xffd60011;
  auVar29._16_4_ = 0xffd60011;
  auVar29._20_4_ = 0xffd60011;
  auVar29._24_4_ = 0xffd60011;
  auVar29._28_4_ = 0xffd60011;
  auVar12 = vpmaddwd_avx2(auVar29,auVar12);
  auVar17 = vpsubd_avx2(auVar14,auVar12);
  auVar14 = vpaddd_avx2(auVar14,auVar12);
  auVar13._8_4_ = 0x10;
  auVar13._0_8_ = 0x1000000010;
  auVar13._12_4_ = 0x10;
  auVar13._16_4_ = 0x10;
  auVar13._20_4_ = 0x10;
  auVar13._24_4_ = 0x10;
  auVar13._28_4_ = 0x10;
  auVar31 = vpaddd_avx2(auVar31,auVar13);
  auVar12 = vpaddd_avx2(auVar16,auVar13);
  auVar14 = vpaddd_avx2(auVar14,auVar13);
  auVar16 = vpaddd_avx2(auVar17,auVar13);
  auVar17 = vpaddd_avx2(auVar33,auVar31);
  auVar13 = vpsubd_avx2(auVar31,auVar33);
  auVar31 = vpaddd_avx2(auVar11,auVar14);
  auVar11 = vpsubd_avx2(auVar14,auVar11);
  auVar33 = vpaddd_avx2(auVar32,auVar16);
  auVar14 = vpsubd_avx2(auVar16,auVar32);
  auVar32 = vpaddd_avx2(auVar15,auVar12);
  auVar15 = vpsubd_avx2(auVar12,auVar15);
  auVar11 = vpsrad_avx2(auVar11,5);
  auVar33 = vpsrad_avx2(auVar33,5);
  auVar33 = vpackssdw_avx2(auVar33,auVar11);
  auVar31 = vpsrad_avx2(auVar31,5);
  auVar11 = vpsrad_avx2(auVar14,5);
  auVar11 = vpackssdw_avx2(auVar31,auVar11);
  auVar31 = vpsrad_avx2(auVar13,5);
  auVar32 = vpsrad_avx2(auVar32,5);
  auVar32 = vpackssdw_avx2(auVar32,auVar31);
  auVar31 = vpsrad_avx2(auVar17,5);
  auVar15 = vpsrad_avx2(auVar15,5);
  auVar15 = vpackssdw_avx2(auVar31,auVar15);
  auVar31 = vpunpcklwd_avx2(auVar15,auVar33);
  auVar33 = vpunpckhwd_avx2(auVar15,auVar33);
  auVar15 = vpunpcklwd_avx2(auVar11,auVar32);
  auVar11 = vpunpckhwd_avx2(auVar11,auVar32);
  auVar14 = vpunpcklwd_avx2(auVar31,auVar15);
  auVar32 = vpunpckhwd_avx2(auVar31,auVar15);
  auVar15 = vpunpcklwd_avx2(auVar33,auVar11);
  auVar33 = vpunpckhwd_avx2(auVar33,auVar11);
  auVar12 = vpunpcklqdq_avx2(auVar14,auVar15);
  auVar11 = vpunpckhqdq_avx2(auVar14,auVar15);
  auVar14 = vpunpcklqdq_avx2(auVar32,auVar33);
  auVar33 = vpunpckhqdq_avx2(auVar32,auVar33);
  auVar2 = vpunpcklwd_avx(auVar11._0_16_,auVar33._0_16_);
  auVar18 = vpunpckhwd_avx(auVar11._0_16_,auVar33._0_16_);
  auVar3 = vpunpcklwd_avx(auVar11._16_16_,auVar33._16_16_);
  auVar1 = vpunpckhwd_avx(auVar11._16_16_,auVar33._16_16_);
  auVar31._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar2;
  auVar31._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
  auVar16._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
  auVar16._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  auVar33 = vpmaddwd_avx2(auVar31,auVar6);
  auVar11 = vpmaddwd_avx2(auVar16,auVar7);
  auVar33 = vpaddd_avx2(auVar11,auVar33);
  auVar11 = vpmaddwd_avx2(auVar31,auVar8);
  auVar32 = vpmaddwd_avx2(auVar16,auVar9);
  auVar11 = vpaddd_avx2(auVar32,auVar11);
  auVar32 = vpmaddwd_avx2(auVar31,auVar10);
  auVar15 = vpmaddwd_avx2(auVar16,auVar19);
  auVar32 = vpaddd_avx2(auVar15,auVar32);
  auVar15 = vpmaddwd_avx2(auVar31,auVar22);
  auVar31 = vpmaddwd_avx2(auVar24,auVar16);
  auVar15 = vpaddd_avx2(auVar31,auVar15);
  auVar2 = vpunpcklwd_avx(auVar12._0_16_,auVar12._16_16_);
  auVar18 = vpunpckhwd_avx(auVar12._0_16_,auVar12._16_16_);
  auVar3 = vpunpcklwd_avx(auVar14._0_16_,auVar14._16_16_);
  auVar1 = vpunpckhwd_avx(auVar14._0_16_,auVar14._16_16_);
  auVar17._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar2;
  auVar17._16_16_ = ZEXT116(1) * auVar18;
  auVar31 = vpmaddwd_avx2(auVar26,auVar17);
  auVar14 = vpmaddwd_avx2(auVar30,auVar17);
  iVar4 = 1 << (0x13U - (char)bit_depth & 0x1f);
  auVar20._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
  auVar20._16_16_ = ZEXT116(1) * auVar1;
  auVar25._4_4_ = iVar4;
  auVar25._0_4_ = iVar4;
  auVar25._8_4_ = iVar4;
  auVar25._12_4_ = iVar4;
  auVar25._16_4_ = iVar4;
  auVar25._20_4_ = iVar4;
  auVar25._24_4_ = iVar4;
  auVar25._28_4_ = iVar4;
  auVar12 = vpmaddwd_avx2(auVar20,auVar21);
  auVar16 = vpmaddwd_avx2(auVar29,auVar20);
  auVar17 = vpsubd_avx2(auVar31,auVar12);
  auVar31 = vpaddd_avx2(auVar25,auVar31);
  auVar31 = vpaddd_avx2(auVar31,auVar12);
  auVar13 = vpsubd_avx2(auVar14,auVar16);
  auVar14 = vpaddd_avx2(auVar25,auVar14);
  auVar14 = vpaddd_avx2(auVar14,auVar16);
  uVar5 = 0x14 - bit_depth;
  auVar12 = vpaddd_avx2(auVar17,auVar25);
  auVar16 = vpaddd_avx2(auVar25,auVar13);
  auVar17 = vpaddd_avx2(auVar31,auVar33);
  auVar13 = vpsubd_avx2(auVar31,auVar33);
  auVar33 = vpaddd_avx2(auVar14,auVar11);
  auVar31 = vpsubd_avx2(auVar14,auVar11);
  auVar11 = vpaddd_avx2(auVar16,auVar32);
  auVar14 = vpsubd_avx2(auVar16,auVar32);
  auVar32 = vpaddd_avx2(auVar12,auVar15);
  auVar12 = vpsubd_avx2(auVar12,auVar15);
  auVar15 = vpsrad_avx2(auVar33,ZEXT416(uVar5));
  auVar33 = vpsrad_avx2(auVar31,ZEXT416(uVar5));
  auVar18 = ZEXT416(uVar5);
  auVar11 = vpsrad_avx2(auVar11,auVar18);
  auVar31 = vpsrad_avx2(auVar14,auVar18);
  auVar33 = vpackssdw_avx2(auVar11,auVar33);
  auVar11 = vpackssdw_avx2(auVar15,auVar31);
  auVar15 = vpsrad_avx2(auVar17,auVar18);
  auVar31 = vpsrad_avx2(auVar13,auVar18);
  auVar32 = vpsrad_avx2(auVar32,ZEXT416(uVar5));
  auVar32 = vpackssdw_avx2(auVar32,auVar31);
  auVar31 = vpsrad_avx2(auVar12,ZEXT416(uVar5));
  auVar15 = vpackssdw_avx2(auVar15,auVar31);
  auVar31 = vpunpcklwd_avx2(auVar15,auVar33);
  auVar33 = vpunpckhwd_avx2(auVar15,auVar33);
  auVar15 = vpunpcklwd_avx2(auVar11,auVar32);
  auVar11 = vpunpckhwd_avx2(auVar11,auVar32);
  auVar14 = vpunpcklwd_avx2(auVar31,auVar15);
  auVar32 = vpunpckhwd_avx2(auVar31,auVar15);
  auVar15 = vpunpcklwd_avx2(auVar33,auVar11);
  auVar33 = vpunpckhwd_avx2(auVar33,auVar11);
  auVar31 = vpunpcklqdq_avx2(auVar14,auVar15);
  auVar11 = vpunpckhqdq_avx2(auVar14,auVar15);
  auVar15 = vpunpcklqdq_avx2(auVar32,auVar33);
  auVar33 = vpunpckhqdq_avx2(auVar32,auVar33);
  auVar14._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar31._0_16_;
  auVar14._16_16_ = ZEXT116(0) * auVar31._16_16_ + ZEXT116(1) * auVar11._0_16_;
  auVar11 = vperm2i128_avx2(auVar31,auVar11,0x31);
  auVar32._0_16_ = ZEXT116(0) * auVar33._0_16_ + ZEXT116(1) * auVar15._0_16_;
  auVar32._16_16_ = ZEXT116(0) * auVar15._16_16_ + ZEXT116(1) * auVar33._0_16_;
  auVar33 = vperm2i128_avx2(auVar15,auVar33,0x31);
  *(undefined1 (*) [32])dst = auVar14;
  *(undefined1 (*) [32])(dst + 0x10) = auVar32;
  *(undefined1 (*) [32])(dst + 0x20) = auVar11;
  *(undefined1 (*) [32])(dst + 0x30) = auVar33;
  return;
}

Assistant:

void itrans_dct2_h8_w8_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[8 * 8]);
    dct2_butterfly_h8_avx2(src, 8, tmp, 8, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h8_avx2(tmp, 8, dst, 8, 20 - bit_depth, bit_depth);
}